

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

void __thiscall
Environment::putFunction(Environment *this,Identifier *ident,Scope scope,ptr<Function> *function)

{
  mapped_type *this_00;
  shared_ptr<Function> local_98 [2];
  Identifier local_78;
  undefined1 local_58 [8];
  Symbol symbol;
  ptr<Function> *function_local;
  Scope scope_local;
  Identifier *ident_local;
  Environment *this_local;
  
  symbol._40_8_ = function;
  std::__cxx11::string::string((string *)&local_78,(string *)ident);
  Symbol::Symbol((Symbol *)local_58,&local_78,true,scope);
  std::__cxx11::string::~string((string *)&local_78);
  std::dynamic_pointer_cast<Member,Function>(local_98);
  this_00 = std::
            unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
            ::operator[](&this->symbols,(key_type *)local_58);
  std::shared_ptr<Member>::operator=(this_00,(shared_ptr<Member> *)local_98);
  std::shared_ptr<Member>::~shared_ptr((shared_ptr<Member> *)local_98);
  Symbol::~Symbol((Symbol *)local_58);
  return;
}

Assistant:

void Environment::putFunction(const Identifier &ident, Scope scope, ptr<Function> function) {
    Symbol symbol(ident, true, scope);
    symbols[symbol] = std::dynamic_pointer_cast<Member>(function);
}